

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_1785d::Indent::~Indent(Indent *this)

{
  Indent *this_local;
  
  std::__cxx11::string::operator=((string *)this->m_indent,(string *)&this->m_save);
  std::__cxx11::string::~string((string *)&this->m_save);
  return;
}

Assistant:

~Indent() { m_indent = m_save; }